

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int calculate_section_intra_ratio(FIRSTPASS_STATS *begin,FIRSTPASS_STATS *end,int section_length)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  for (iVar1 = 0; (begin < end && (iVar1 < section_length)); iVar1 = iVar1 + 1) {
    dVar2 = dVar2 + begin->intra_error;
    dVar3 = dVar3 + begin->coded_error;
    begin = begin + 1;
  }
  return (int)(dVar2 / (dVar3 + *(double *)(&DAT_0043ac90 + (ulong)(dVar3 < 0.0) * 8)));
}

Assistant:

static int calculate_section_intra_ratio(const FIRSTPASS_STATS *begin,
                                         const FIRSTPASS_STATS *end,
                                         int section_length) {
  const FIRSTPASS_STATS *s = begin;
  double intra_error = 0.0;
  double coded_error = 0.0;
  int i = 0;

  while (s < end && i < section_length) {
    intra_error += s->intra_error;
    coded_error += s->coded_error;
    ++s;
    ++i;
  }

  return (int)(intra_error / DOUBLE_DIVIDE_CHECK(coded_error));
}